

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3825::read_hex
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *data)

{
  pointer *ppuVar1;
  iterator __position;
  ulong uVar2;
  uint c;
  istringstream iss;
  uint local_1d4;
  string local_1d0;
  undefined7 uStack_1cf;
  undefined1 local_1c0 [16];
  long local_1b0 [3];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,data->_M_string_length >> 1);
  if (data->_M_string_length != 0) {
    uVar2 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)data);
      std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,&local_1d0,_S_in);
      if ((undefined1 *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
        operator_delete((undefined1 *)CONCAT71(uStack_1cf,local_1d0));
      }
      *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
           *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffffb5 | 8;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
      local_1d4 = (uint)(byte)local_1d0;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_int>
                  (__return_storage_ptr__,__position,&local_1d4);
      }
      else {
        *__position._M_current = (uchar)local_1d0;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      uVar2 = uVar2 + 2;
    } while (uVar2 < data->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> read_hex(const std::string& data) {
    std::vector<uint8_t> res;
    res.reserve(data.size() / 2);

    for (std::size_t i = 0; i < data.size(); i += 2) {
      std::istringstream iss{data.substr(i, 2)};
      unsigned int c;
      iss >> std::hex >> c;
      res.emplace_back(c & 0xff);
    }
    return res;
  }